

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O1

Vec3fa __thiscall embree::mylerp(embree *this,float f,Vec3fa *a,Vec3fa *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec3fa VVar6;
  
  fVar5 = 1.0 - f;
  fVar1 = (a->field_0).m128[2];
  fVar2 = (a->field_0).m128[3];
  VVar6.field_0._8_4_ = fVar5 * (a->field_0).m128[0];
  VVar6.field_0._12_4_ = fVar5 * (a->field_0).m128[1];
  fVar3 = (b->field_0).m128[2];
  fVar4 = (b->field_0).m128[3];
  VVar6.field_0._0_4_ = f * (b->field_0).m128[0] + VVar6.field_0._8_4_;
  VVar6.field_0._4_4_ = f * (b->field_0).m128[1] + VVar6.field_0._12_4_;
  *(float *)this = VVar6.field_0._0_4_;
  *(float *)(this + 4) = VVar6.field_0._4_4_;
  *(float *)(this + 8) = f * fVar3 + fVar5 * fVar1;
  *(float *)(this + 0xc) = f * fVar4 + fVar5 * fVar2;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa mylerp(float f, const Vec3fa& a, const Vec3fa& b) { // FIXME: use lerpr, need to make ISPC lerpr and C++ lerpr compatible first
  return (1.0f-f)*a + f*b;
}